

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O2

int MRIStepGetNonlinearSystemData
              (void *arkode_mem,realtype *tcur,N_Vector *zpred,N_Vector *z,N_Vector *F,
              realtype *gamma,N_Vector *sdata,void **user_data)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_38;
  ARKodeMem local_30;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepGetNonlinearSystemData",&local_30,&local_38);
  if (iVar1 == 0) {
    *tcur = local_30->tcur;
    *zpred = local_38->zpred;
    *z = local_30->ycur;
    *F = local_38->Fsi[local_38->stage_map[local_38->istage]];
    *gamma = local_38->gamma;
    *sdata = local_38->sdata;
    *user_data = local_30->user_data;
  }
  return iVar1;
}

Assistant:

int MRIStepGetNonlinearSystemData(void *arkode_mem, realtype *tcur,
                                  N_Vector *zpred, N_Vector *z,
                                  N_Vector *F, realtype *gamma,
                                  N_Vector *sdata, void **user_data)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetNonlinearSystemData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *tcur      = ark_mem->tcur;
  *zpred     = step_mem->zpred;
  *z         = ark_mem->ycur;
  *F         = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  *gamma     = step_mem->gamma;
  *sdata     = step_mem->sdata;
  *user_data = ark_mem->user_data;

  return(ARK_SUCCESS);
}